

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall
Manifold_MeshRelationRefinePrecision_Test::TestBody(Manifold_MeshRelationRefinePrecision_Test *this)

{
  allocator<MeshSize> *this_00;
  initializer_list<MeshSize> __l;
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_1;
  Message local_3b0;
  int local_3a4;
  size_type local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_308 [4];
  undefined1 local_2a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> runOriginalID;
  MeshSize local_280;
  iterator local_270;
  size_type local_268;
  vector<MeshSize,_std::allocator<MeshSize>_> local_260;
  Manifold local_248 [16];
  vector<manifold::Smoothness,_std::allocator<manifold::Smoothness>_> local_238;
  MeshGLP local_220 [8];
  Manifold csaszar;
  value_type local_210 [2];
  int id;
  MeshGLP<float,_unsigned_int> local_200;
  Manifold local_118 [16];
  Manifold local_108 [16];
  undefined1 local_f8 [8];
  MeshGL inGL;
  Manifold_MeshRelationRefinePrecision_Test *this_local;
  
  inGL._224_8_ = this;
  Csaszar();
  manifold::Manifold::Manifold(local_118,(MeshGLP *)&local_200);
  WithPositionColors(local_108);
  manifold::Manifold::GetMeshGL((int)local_f8);
  manifold::Manifold::~Manifold(local_108);
  manifold::Manifold::~Manifold(local_118);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_200);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &inGL.runIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_210[0] = *pvVar2;
  local_238.super__Vector_base<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>::vector(&local_238);
  manifold::Manifold::Smooth(local_220,(vector *)local_f8);
  std::vector<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>::~vector(&local_238);
  manifold::Manifold::RefineToTolerance(0.05);
  manifold::Manifold::operator=((Manifold *)local_220,local_248);
  manifold::Manifold::~Manifold(local_248);
  local_280.numVert = 0xa7c;
  local_280.numTri = 0x14f8;
  local_280.numProp = 3;
  local_280.numPropVert = 0xa7c;
  local_270 = &local_280;
  local_268 = 1;
  this_00 = (allocator<MeshSize> *)
            ((long)&runOriginalID.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<MeshSize>::allocator(this_00);
  __l._M_len = local_268;
  __l._M_array = local_270;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector(&local_260,__l,this_00);
  ExpectMeshes((Manifold *)local_220,&local_260);
  std::vector<MeshSize,_std::allocator<MeshSize>_>::~vector(&local_260);
  std::allocator<MeshSize>::~allocator
            ((allocator<MeshSize> *)
             ((long)&runOriginalID.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  manifold::Manifold::GetMeshGL((int)&gtest_ar + 8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,local_308);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP
            ((MeshGLP<float,_unsigned_int> *)&gtest_ar.message_);
  local_3a0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  local_3a4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_398,"runOriginalID.size()","1",&local_3a0,&local_3a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x259,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0,0);
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_3c8,"runOriginalID[0]","id",pvVar2,(int *)local_210);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x25a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2a0);
  manifold::Manifold::~Manifold((Manifold *)local_220);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)local_f8);
  return;
}

Assistant:

TEST(Manifold, MeshRelationRefinePrecision) {
  MeshGL inGL = WithPositionColors(Csaszar()).GetMeshGL();
  const int id = inGL.runOriginalID[0];
  Manifold csaszar = Manifold::Smooth(inGL);

  csaszar = csaszar.RefineToTolerance(0.05);
  ExpectMeshes(csaszar, {{2684, 5368, 3}});
  std::vector<uint32_t> runOriginalID = csaszar.GetMeshGL().runOriginalID;
  EXPECT_EQ(runOriginalID.size(), 1);
  EXPECT_EQ(runOriginalID[0], id);

#ifdef MANIFOLD_EXPORT
  ExportOptions opt;
  opt.mat.roughness = 1;
  opt.mat.colorIdx = 0;
  if (options.exportModels)
    ExportMesh("csaszarSmooth.glb", csaszar.GetMeshGL(), opt);
#endif
}